

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  ulong uVar1;
  size_t paragraphWidth;
  bool bVar2;
  ostream *poVar3;
  allocator local_2c9;
  string local_2c8;
  string local_2a8;
  int local_284;
  byte local_27e;
  allocator local_27d;
  byte local_27c;
  byte local_27b;
  byte local_27a;
  allocator local_279;
  string local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  string name;
  stringstream out;
  ostream local_198 [376];
  App *local_20;
  App *sub_local;
  Formatter *this_local;
  
  local_20 = sub;
  sub_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(name.field_2._M_local_buf + 8));
  App::get_display_name_abi_cxx11_(&local_208,local_20,true);
  ::std::operator+(&local_1e8,"  ",&local_208);
  local_27a = 0;
  local_27b = 0;
  local_27c = 0;
  local_27e = 0;
  bVar2 = App::get_required(local_20);
  if (bVar2) {
    ::std::allocator<char>::allocator();
    local_27a = 1;
    ::std::__cxx11::string::string((string *)&local_278,"REQUIRED",&local_279);
    local_27b = 1;
    FormatterBase::get_label(&local_258,&this->super_FormatterBase,&local_278);
    local_27c = 1;
    ::std::operator+(&local_238," ",&local_258);
  }
  else {
    ::std::allocator<char>::allocator();
    local_27e = 1;
    ::std::__cxx11::string::string((string *)&local_238,"",&local_27d);
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   &local_1e8,&local_238);
  ::std::__cxx11::string::~string((string *)&local_238);
  if ((local_27e & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)&local_27d);
  }
  if ((local_27c & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_258);
  }
  if ((local_27b & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_278);
  }
  if ((local_27a & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  }
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_208);
  local_284 = (int)std::setw((int)(this->super_FormatterBase).column_width_);
  poVar3 = ::std::operator<<(local_198,(_Setw)local_284);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,std::left);
  ::std::operator<<(poVar3,(string *)local_1c8);
  App::get_description_abi_cxx11_(&local_2a8,local_20);
  uVar1 = (this->super_FormatterBase).column_width_;
  paragraphWidth = (this->super_FormatterBase).right_column_width_;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2c8,uVar1,' ',&local_2c9);
  detail::streamOutAsParagraph(local_198,&local_2a8,paragraphWidth,&local_2c8,true);
  ::std::__cxx11::string::~string((string *)&local_2c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::operator<<(local_198,'\n');
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::string::~string((string *)local_1c8);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    std::string name = "  " + sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : "");

    out << std::setw(static_cast<int>(column_width_)) << std::left << name;
    detail::streamOutAsParagraph(
        out, sub->get_description(), right_column_width_, std::string(column_width_, ' '), true);
    out << '\n';
    return out.str();
}